

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::GetSubObjects(ObjEncoder *this)

{
  GeometryMetadata *this_00;
  ObjEncoder *pOVar1;
  AttributeMetadata *pAVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  PointAttribute *pPVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_draco::EntryValue>_>_>
  *__range1;
  bool bVar6;
  int value;
  allocator<char> local_7a;
  allocator<char> local_79;
  ObjEncoder *local_78;
  string local_70;
  string local_50;
  
  this_00 = (this->in_point_cloud_->metadata_)._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  bVar6 = true;
  if (this_00 != (GeometryMetadata *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"name",&local_79);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"sub_obj",&local_7a);
    pAVar2 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    if (pAVar2 != (AttributeMetadata *)0x0) {
      local_78 = this;
      std::
      _Hashtable<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::clear(&(this->sub_obj_id_to_name_)._M_h);
      for (p_Var4 = (pAVar2->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; pOVar1 = local_78,
          (_Rb_tree_header *)p_Var4 !=
          &(pAVar2->super_Metadata).entries_._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        local_70._M_dataplus._M_p._0_4_ = 0;
        if ((long)p_Var4[2]._M_parent - (long)*(undefined4 **)(p_Var4 + 2) == 4) {
          local_70._M_dataplus._M_p._0_4_ = **(undefined4 **)(p_Var4 + 2);
          pmVar3 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this->sub_obj_id_to_name_,(key_type *)&local_70);
          std::__cxx11::string::_M_assign((string *)pmVar3);
        }
      }
      pPVar5 = PointCloud::GetAttributeByUniqueId(local_78->in_point_cloud_,pAVar2->att_unique_id_);
      pOVar1->sub_obj_att_ = pPVar5;
      if ((pPVar5 == (PointAttribute *)0x0) || (pPVar5->num_unique_entries_ == 0)) {
        bVar6 = false;
      }
      else {
        bVar6 = (pPVar5->super_GeometryAttribute).num_components_ == '\x01';
      }
    }
  }
  return bVar6;
}

Assistant:

bool ObjEncoder::GetSubObjects() {
  const GeometryMetadata *pc_metadata = in_point_cloud_->GetMetadata();
  if (!pc_metadata) {
    return true;
  }
  const AttributeMetadata *sub_obj_metadata =
      pc_metadata->GetAttributeMetadataByStringEntry("name", "sub_obj");
  if (!sub_obj_metadata) {
    return true;
  }
  sub_obj_id_to_name_.clear();
  for (const auto &entry : sub_obj_metadata->entries()) {
    // Sub-object id must be int.
    int value = 0;
    if (!entry.second.GetValue(&value)) {
      continue;
    }
    sub_obj_id_to_name_[value] = entry.first;
  }
  sub_obj_att_ = in_point_cloud_->GetAttributeByUniqueId(
      sub_obj_metadata->att_unique_id());
  if (sub_obj_att_ == nullptr || sub_obj_att_->size() == 0 ||
      sub_obj_att_->num_components() != 1) {
    return false;
  }
  return true;
}